

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

void __thiscall MinVR::element::element(element *this,element *node)

{
  element *peVar1;
  _List_node_base *p_Var2;
  _List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> local_60;
  string local_48;
  
  (this->m_attribute_list).super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->m_attribute_list).super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  p_Var2 = (_List_node_base *)&this->m_element_list;
  (this->m_attribute_list).super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->it)._M_node = (_List_node_base *)0x0;
  (this->m_attribute_iterator)._M_node = (_List_node_base *)0x0;
  (this->m_element_list).super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = p_Var2;
  (this->m_element_list).super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = p_Var2;
  (this->m_element_list).super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->m_element_iterator)._M_node = (_List_node_base *)0x0;
  (this->i)._M_node = (_List_node_base *)0x0;
  (this->m_comment_list).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_comment_list;
  (this->m_comment_list).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_comment_list;
  (this->ic)._M_node = (_List_node_base *)0x0;
  (this->m_comment_list).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node._M_size =
       0;
  (this->m_comment_iterator)._M_node = (_List_node_base *)0x0;
  this->is_empty_attribute_list = true;
  this->name_is_allocated = false;
  this->is_comment = false;
  this->m_name = (char *)0x0;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  this->m_parent = (element *)0x0;
  peVar1 = this;
  if (node != (element *)0x0) {
    std::__cxx11::string::string((string *)&local_48,(string *)&node->m_value);
    set_value(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    set_name(this,node->m_name);
    std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::list
              ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)&local_60,
               &node->m_attribute_list);
    std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_move_assign
              (&this->m_attribute_list,&local_60);
    std::__cxx11::_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_clear
              (&local_60);
    std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::list
              ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&local_60,
               &node->m_element_list);
    std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_move_assign
              ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)p_Var2,
               (_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&local_60);
    std::__cxx11::_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_clear
              ((_List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&local_60);
    p_Var2 = (this->m_element_list).
             super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    peVar1 = (element *)
             (this->m_attribute_list).
             super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  (this->m_element_iterator)._M_node = p_Var2;
  (this->m_attribute_iterator)._M_node = (_List_node_base *)peVar1;
  return;
}

Assistant:

element::element(element* node) : is_empty_attribute_list(true),
                               //value_is_allocated(false),
                               name_is_allocated(false),
                               is_comment(false),
                               m_name(NULL),
                               //m_value(NULL),
                               m_parent(NULL)
{
    if(node != NULL)
    {
        set_value(node->get_value());
        set_name(node->get_name());
        m_attribute_list = node->get_attribute_list();
        m_element_list = node->get_element_list();
    }
    m_element_iterator = m_element_list.begin();
    m_attribute_iterator = m_attribute_list.begin();
}